

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_tokens_test.cc
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  int iVar4;
  string input_tree;
  string correct_result;
  string line;
  string computed_results;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  BracketNotationParser<label::StringLabel> bnp;
  ifstream test_cases_file;
  byte abStack_218 [488];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Tokens test.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ifstream::ifstream(&test_cases_file,"parser_tokens_test_data.txt",_S_in);
  if ((abStack_218[*(long *)(_test_cases_file + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Problem reading the test file.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar4 = 0;
  do {
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&test_cases_file,(string *)&line);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        iVar4 = 0;
        goto LAB_00102666;
      }
    } while (*line._M_dataplus._M_p != '#');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&test_cases_file,(string *)&line);
    std::__cxx11::string::string((string *)&input_tree,(string *)&line);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&test_cases_file,(string *)&line);
    std::__cxx11::string::string((string *)&correct_result,(string *)&line);
    parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&bnp);
    bVar1 = parser::BracketNotationParser<label::StringLabel>::validate_input(&bnp,&input_tree);
    if (bVar1) {
      parser::BracketNotationParser<label::StringLabel>::get_tokens(&local_310,&bnp,&input_tree);
      vector_to_string(&computed_results,&local_310);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_310);
      bVar1 = std::operator!=(&correct_result,&computed_results);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Incorrect tokens: ");
        poVar2 = std::operator<<(poVar2,(string *)&computed_results);
        poVar2 = std::operator<<(poVar2," instead of ");
        poVar2 = std::operator<<(poVar2,(string *)&correct_result);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&input_tree);
        std::endl<char,std::char_traits<char>>(poVar2);
        iVar4 = -1;
      }
      bVar1 = !bVar1;
      std::__cxx11::string::~string((string *)&computed_results);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
      poVar2 = std::operator<<(poVar2,(string *)&input_tree);
      poVar2 = std::operator<<(poVar2,"\'. Is the number of opening and closing brackets equal?");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = false;
      iVar4 = -1;
    }
    parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser(&bnp);
    std::__cxx11::string::~string((string *)&correct_result);
    std::__cxx11::string::~string((string *)&input_tree);
  } while (bVar1);
LAB_00102666:
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&test_cases_file);
  return iVar4;
}

Assistant:

int main() {

  using Label = label::StringLabel;
  
  std::cout << "Tokens test." << std::endl;

  // Parse test cases from file.
  std::ifstream test_cases_file("parser_tokens_test_data.txt");

  if (!test_cases_file) {
    std::cerr << "ERROR: Problem reading the test file." << std::endl;
  }

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::getline(test_cases_file, line);
      std::string input_tree = line;
      std::getline(test_cases_file, line);
      std::string correct_result = line;

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(input_tree)) {
        std::cerr << "Incorrect format of input tree: '" << input_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      std::string computed_results = vector_to_string(bnp.get_tokens(input_tree));

      if (correct_result != computed_results) {
        std::cerr << "Incorrect tokens: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree << std::endl;
        return -1;
      }
    }
  }

  return 0;
}